

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path,bool skip_extensions)

{
  FieldDescriptor **ppFVar1;
  uint8_t uVar2;
  char *pcVar3;
  void *pvVar4;
  DescriptorBuilder *pDVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_05;
  bool bVar6;
  FieldDescriptor *pFVar7;
  const_iterator intermediate_fields_iter;
  size_t __ptr;
  bool v1;
  undefined1 v1_00;
  bool bVar8;
  bool bVar9;
  undefined1 extraout_AL;
  int iVar10;
  int iVar11;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *pVVar12;
  Symbol SVar13;
  Symbol SVar14;
  UnknownFieldSet *pUVar15;
  LogMessage *this_00;
  Nonnull<const_char_*> pcVar16;
  byte bVar17;
  UninterpretedOption *descriptor_00;
  pointer pcVar18;
  size_type sVar19;
  DescriptorBuilder *pDVar20;
  MaybeInitializedPtr *pMVar21;
  iterator iVar22;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view str;
  string_view str_00;
  string_view str_01;
  Metadata MVar23;
  string_view relative_to;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  FieldDescriptor *field;
  string outstr;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  vector<int,_std::allocator<int>_> dest_path;
  Descriptor *descriptor;
  string debug_msg_name;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  UnknownFieldSet *local_140;
  FieldDescriptor *local_138;
  MaybeInitializedPtr local_130;
  MaybeInitializedPtr MStack_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  Message *local_100;
  const_iterator local_f8;
  iterator iStack_f0;
  FieldDescriptor **local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  DescriptorBuilder *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  HeapOrSoo local_a0 [3];
  AlphaNum local_70;
  vector<int,_std::allocator<int>_> *local_40;
  Type local_34;
  
  descriptor_00 = this->uninterpreted_option_;
  local_100 = options;
  if ((descriptor_00->field_0)._impl_.name_.super_RepeatedPtrFieldBase.current_size_ == 0) {
    if (skip_extensions) {
      return true;
    }
    pDVar20 = this->builder_;
    pcVar18 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar19 = (this->options_to_interpret_->element_name)._M_string_length;
    MStack_128.p = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__0,std::__cxx11::string>
    ;
LAB_00f2b26a:
    local_130.p = local_a0;
    make_error_05.invoker_._0_4_ = SUB84(MStack_128,0);
    make_error_05.ptr_.obj = local_130.p;
    make_error_05.invoker_._4_4_ = 0;
    element_name_05._M_str = pcVar18;
    element_name_05._M_len = sVar19;
    AddError(pDVar20,element_name_05,&descriptor_00->super_Message,OPTION_NAME,make_error_05);
    return false;
  }
  pVVar12 = protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(descriptor_00->field_0)._impl_.name_.super_RepeatedPtrFieldBase,0);
  iVar10 = std::__cxx11::string::compare
                     ((char *)((ulong)(pVVar12->field_0)._impl_.name_part_.tagged_ptr_.ptr_ &
                              0xfffffffffffffffc));
  if (iVar10 == 0) {
    if (skip_extensions) {
      return true;
    }
    pDVar20 = this->builder_;
    pcVar18 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar19 = (this->options_to_interpret_->element_name)._M_string_length;
    descriptor_00 = this->uninterpreted_option_;
    MStack_128.p = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__1,std::__cxx11::string>
    ;
    goto LAB_00f2b26a;
  }
  local_40 = src_path;
  pVVar12 = protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(this->uninterpreted_option_->field_0)._impl_.name_.
                        super_RepeatedPtrFieldBase,0);
  bVar8 = true;
  if ((pVVar12->field_0)._impl_.is_extension_ == skip_extensions) {
    return true;
  }
  pDVar20 = this->builder_;
  MVar23 = Message::GetMetadata(local_100);
  pcVar3 = ((MVar23.descriptor)->all_names_).payload_;
  name._M_len = (ulong)*(ushort *)(pcVar3 + 2);
  name._M_str = pcVar3 + ~name._M_len;
  SVar13 = FindSymbolNotEnforcingDeps(pDVar20,name,true);
  SVar14.ptr_ = (SymbolBase *)(DescriptorBuilder *)0x0;
  if ((SVar13.ptr_)->symbol_type_ == '\x01') {
    SVar14 = SVar13;
  }
  if ((DescriptorBuilder *)SVar14.ptr_ == (DescriptorBuilder *)0x0) {
    MVar23 = Message::GetMetadata(local_100);
    SVar14.ptr_ = &(MVar23.descriptor)->super_SymbolBase;
  }
  bVar17 = (byte)SVar13.ptr_;
  if ((DescriptorBuilder *)SVar14.ptr_ == (DescriptorBuilder *)0x0) {
    InterpretSingleOption((OptionInterpreter *)&local_130);
    v1_00 = extraout_AL;
LAB_00f2b632:
    pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)v1_00,0xbf < bVar17,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  else {
    local_138 = (FieldDescriptor *)0x0;
    local_e8 = (FieldDescriptor **)0x0;
    local_f8._M_current = (FieldDescriptor **)0x0;
    iStack_f0._M_current = (FieldDescriptor **)0x0;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_c8 = (DescriptorBuilder *)SVar14.ptr_;
    std::vector<int,_std::allocator<int>_>::vector(&local_e0,options_path);
    iVar10 = *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10);
    bVar9 = 0 < iVar10;
    if (0 < iVar10) {
      iVar10 = 0;
      bVar9 = true;
      do {
        pDVar20 = this->builder_;
        (pDVar20->undefine_resolved_name_)._M_string_length = 0;
        *(pDVar20->undefine_resolved_name_)._M_dataplus._M_p = '\0';
        pVVar12 = protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                            (&(this->uninterpreted_option_->field_0)._impl_.name_.
                              super_RepeatedPtrFieldBase,iVar10);
        pvVar4 = (pVVar12->field_0)._impl_.name_part_.tagged_ptr_.ptr_;
        if (local_c0._M_string_length != 0) {
          local_130 = (MaybeInitializedPtr)0x1;
          MStack_128.p = ".";
          absl::lts_20250127::StrAppend(&local_c0,(AlphaNum *)&local_130);
        }
        pVVar12 = protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                            (&(this->uninterpreted_option_->field_0)._impl_.name_.
                              super_RepeatedPtrFieldBase,iVar10);
        pMVar21 = (MaybeInitializedPtr *)((ulong)pvVar4 & 0xfffffffffffffffc);
        if ((pVVar12->field_0)._impl_.is_extension_ == true) {
          local_130 = (MaybeInitializedPtr)0x1;
          MStack_128.p = "(";
          local_a0[0]._8_8_ = *pMVar21;
          local_a0[0]._0_8_ = pMVar21[1];
          local_70.piece_._M_len = 1;
          local_70.piece_._M_str = ")";
          absl::lts_20250127::StrAppend
                    (&local_c0,(AlphaNum *)&local_130,(AlphaNum *)&local_a0[0].heap,&local_70);
          pDVar20 = this->builder_;
          name_00._M_str = (char *)pMVar21->p;
          name_00._M_len = (size_t)pMVar21[1].p;
          relative_to._M_str = (this->options_to_interpret_->name_scope)._M_dataplus._M_p;
          relative_to._M_len = (this->options_to_interpret_->name_scope)._M_string_length;
          local_138 = (FieldDescriptor *)
                      LookupSymbol(pDVar20,name_00,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
          if (((SymbolBase *)local_138)->symbol_type_ != '\x02') {
            local_138 = (FieldDescriptor *)0x0;
          }
        }
        else {
          MStack_128.p = *(void **)pMVar21;
          local_130 = pMVar21[1];
          absl::lts_20250127::StrAppend(&local_c0,(AlphaNum *)&local_130);
          name_01._M_str = (char *)pMVar21->p;
          name_01._M_len = (size_t)pMVar21[1].p;
          pDVar20 = local_c8;
          local_138 = Descriptor::FindFieldByName((Descriptor *)local_c8,name_01);
        }
        if (local_138 == (FieldDescriptor *)0x0) {
          pDVar20 = this->builder_;
          if (pDVar20->pool_->allow_unknown_ != true) {
            if ((pDVar20->undefine_resolved_name_)._M_string_length == 0) {
              local_a0[0]._0_8_ = &local_c0;
              local_130.p = local_a0;
              MStack_128.p = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__3,std::__cxx11::string>
              ;
              make_error_01.invoker_._0_4_ = 0xf38dcf;
              make_error_01.ptr_.obj = local_130.p;
              make_error_01.invoker_._4_4_ = 0;
              element_name_01._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_01._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              AddError(pDVar20,element_name_01,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_01);
            }
            else {
              local_a0[0]._0_8_ = &local_c0;
              local_130.p = local_a0;
              MStack_128.p = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__2,std::__cxx11::string>
              ;
              make_error_00.invoker_._0_4_ = 0xf38cae;
              make_error_00.ptr_.obj = local_130.p;
              make_error_00.invoker_._4_4_ = 0;
              element_name_00._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_00._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              local_a0[0]._8_8_ = this;
              AddError(pDVar20,element_name_00,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_00);
            }
            goto LAB_00f2b19e;
          }
LAB_00f2aed1:
          AddWithoutInterpreting((OptionInterpreter *)pDVar20,this->uninterpreted_option_,local_100)
          ;
          bVar8 = true;
          bVar6 = false;
        }
        else {
          pDVar5 = (DescriptorBuilder *)local_138->containing_type_;
          if (pDVar5 == local_c8) {
            local_130._0_4_ = local_138->number_;
            if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_e0,
                         (iterator)
                         local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_130);
            }
            else {
              *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_138->number_;
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            if (local_138->file_ == this->builder_->file_) {
              pVVar12 = protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                  (&(this->uninterpreted_option_->field_0)._impl_.name_.
                                    super_RepeatedPtrFieldBase,0);
              iVar11 = std::__cxx11::string::compare
                                 ((char *)((ulong)(pVVar12->field_0)._impl_.name_part_.tagged_ptr_.
                                                  ptr_ & 0xfffffffffffffffc));
              if ((iVar11 == 0) &&
                 (pVVar12 = protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                                      (&(this->uninterpreted_option_->field_0)._impl_.name_.
                                        super_RepeatedPtrFieldBase,0),
                 (pVVar12->field_0)._impl_.is_extension_ == false)) {
                local_a0[0]._0_8_ = &local_c0;
                local_130.p = local_a0;
                MStack_128.p = absl::lts_20250127::functional_internal::
                               InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__5,std::__cxx11::string>
                ;
                make_error_04.invoker_._0_4_ = 0xf38ed1;
                make_error_04.ptr_.obj = local_130.p;
                make_error_04.invoker_._4_4_ = 0;
                element_name_04._M_str =
                     (this->options_to_interpret_->element_name)._M_dataplus._M_p;
                element_name_04._M_len =
                     (this->options_to_interpret_->element_name)._M_string_length;
                AddError(this->builder_,element_name_04,&this->uninterpreted_option_->super_Message,
                         OPTION_NAME,make_error_04);
                goto LAB_00f2b19e;
              }
            }
            pFVar7 = local_138;
            bVar6 = true;
            if ((this->uninterpreted_option_->field_0)._impl_.name_.super_RepeatedPtrFieldBase.
                current_size_ + -1 <= iVar10) goto LAB_00f2b1a3;
            if ((local_138->type_ & 0xfe) == 10) {
              bVar17 = local_138->field_0x1;
              v1 = (bool)((bVar17 & 0x20) >> 5);
              if (0xbf < bVar17 == v1) {
                pcVar16 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                    (v1,0xbf < bVar17,
                                     "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED")
                ;
              }
              if (pcVar16 != (Nonnull<const_char_*>)0x0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&local_130,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb54,pcVar16);
                goto LAB_00f2b739;
              }
              if ((pFVar7->field_0x1 & 0x20) == 0) {
                if (iStack_f0._M_current == local_e8) {
                  std::
                  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                              *)&local_f8,iStack_f0,&local_138);
                }
                else {
                  *iStack_f0._M_current = local_138;
                  iStack_f0._M_current = iStack_f0._M_current + 1;
                }
                local_c8 = (DescriptorBuilder *)FieldDescriptor::message_type(local_138);
                goto LAB_00f2b1a3;
              }
              local_a0[0]._0_8_ = &local_c0;
              local_130.p = local_a0;
              MStack_128.p = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__7,std::__cxx11::string>
              ;
              make_error_03.invoker_._0_4_ = 0xf38f93;
              make_error_03.ptr_.obj = local_130.p;
              make_error_03.invoker_._4_4_ = 0;
              element_name_03._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_03._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              AddError(this->builder_,element_name_03,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_03);
            }
            else {
              local_a0[0]._0_8_ = &local_c0;
              local_130.p = local_a0;
              MStack_128.p = absl::lts_20250127::functional_internal::
                             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__6,std::__cxx11::string>
              ;
              make_error_02.invoker_._0_4_ = 0xf38f32;
              make_error_02.ptr_.obj = local_130.p;
              make_error_02.invoker_._4_4_ = 0;
              element_name_02._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
              element_name_02._M_len = (this->options_to_interpret_->element_name)._M_string_length;
              AddError(this->builder_,element_name_02,&this->uninterpreted_option_->super_Message,
                       OPTION_NAME,make_error_02);
            }
          }
          else {
            if ((pDVar5 != (DescriptorBuilder *)0x0) && (((ulong)pDVar5->pool_ & 0x100) != 0))
            goto LAB_00f2aed1;
            local_a0[0]._0_8_ = &local_c0;
            local_a0[0]._8_8_ = &local_c8;
            local_130.p = local_a0;
            MStack_128.p = absl::lts_20250127::functional_internal::
                           InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__4,std::__cxx11::string>
            ;
            make_error.invoker_._0_4_ = 0xf38e4a;
            make_error.ptr_.obj = local_130.p;
            make_error.invoker_._4_4_ = 0;
            element_name._M_str = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
            element_name._M_len = (this->options_to_interpret_->element_name)._M_string_length;
            AddError(this->builder_,element_name,&this->uninterpreted_option_->super_Message,
                     OPTION_NAME,make_error);
          }
LAB_00f2b19e:
          bVar6 = false;
          bVar8 = false;
        }
LAB_00f2b1a3:
        if (!bVar6) break;
        iVar10 = iVar10 + 1;
        iVar11 = *(int *)((long)&this->uninterpreted_option_->field_0 + 0x10);
        bVar9 = iVar10 < iVar11;
      } while (iVar10 < iVar11);
    }
    if (bVar9) goto LAB_00f2b5ba;
    bVar17 = local_138->field_0x1;
    v1_00 = (bVar17 & 0x20) >> 5;
    options_path = (vector<int,_std::allocator<int>_> *)local_138;
    if (0xbf < bVar17 != (bool)v1_00) goto LAB_00f2b632;
    pcVar16 = (Nonnull<const_char_*>)0x0;
  }
  iVar22._M_current = iStack_f0._M_current;
  intermediate_fields_iter._M_current = local_f8._M_current;
  pFVar7 = local_138;
  if (pcVar16 == (Nonnull<const_char_*>)0x0) {
    if ((((FieldDescriptor *)options_path)->field_0x1 & 0x20) == 0) {
      MVar23 = Message::GetMetadata(local_100);
      pUVar15 = Reflection::GetUnknownFields(MVar23.reflection,local_100);
      bVar8 = ExamineIfOptionIsSet
                        (this,intermediate_fields_iter,(const_iterator)iVar22._M_current,pFVar7,
                         &local_c0,pUVar15);
      if (!bVar8) {
        bVar8 = false;
        goto LAB_00f2b5ba;
      }
    }
    local_70.piece_._M_len = (size_t)operator_new(0x10);
    (((UnknownFieldSet *)local_70.piece_._M_len)->fields_).soo_rep_.field_0.long_rep.elements_int =
         0;
    (((UnknownFieldSet *)local_70.piece_._M_len)->fields_).soo_rep_.field_0.short_rep.field_1 =
         (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    bVar8 = SetOptionValue(this,local_138,(UnknownFieldSet *)local_70.piece_._M_len);
    if (bVar8) {
      if (iStack_f0._M_current != local_f8._M_current) {
        iVar22._M_current = iStack_f0._M_current;
        do {
          local_140 = (UnknownFieldSet *)operator_new(0x10);
          (local_140->fields_).soo_rep_.field_0.long_rep.elements_int = 0;
          (local_140->fields_).soo_rep_.field_0.short_rep.field_1 =
               (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
          ppFVar1 = iVar22._M_current + -1;
          uVar2 = iVar22._M_current[-1]->type_;
          if (uVar2 == '\n') {
            pUVar15 = UnknownFieldSet::AddGroup(local_140,iVar22._M_current[-1]->number_);
            UnknownFieldSet::MergeFrom(pUVar15,(UnknownFieldSet *)local_70.piece_._M_len);
          }
          else {
            if (uVar2 != '\v') {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_130,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x25c5);
              str_01._M_str = "Invalid wire type for CPPTYPE_MESSAGE: ";
              str_01._M_len = 0x27;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)&local_130,str_01);
              local_34 = (Type)iVar22._M_current[-1]->type_;
              absl::lts_20250127::log_internal::LogMessage::
              operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                        ((LogMessage *)&local_130,&local_34);
              goto LAB_00f2b739;
            }
            MStack_128.p = (code *)0x0;
            local_120 = 0;
            local_130.p = &local_120;
            bVar9 = UnknownFieldSet::SerializeToString
                              ((UnknownFieldSet *)local_70.piece_._M_len,(string *)&local_130);
            if (!bVar9) {
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_a0[0].heap,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                         ,0x25b6,"unknown_fields->SerializeToString(&outstr)");
              str._M_str = "Unexpected failure while serializing option submessage ";
              str._M_len = 0x37;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        ((LogMessage *)&local_a0[0].heap,str);
              this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                                  ((LogMessage *)&local_a0[0].heap,&local_c0);
              str_00._M_str = "\".";
              str_00._M_len = 2;
              absl::lts_20250127::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                        (this_00,str_00);
              if (!bVar9) {
                absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&local_a0[0].heap);
              }
            }
            UnknownFieldSet::AddLengthDelimited<>
                      (local_140,(*ppFVar1)->number_,(string *)&local_130);
            if ((undefined1 *)local_130.p != &local_120) {
              operator_delete(local_130.p,CONCAT71(uStack_11f,local_120) + 1);
            }
          }
          __ptr = local_70.piece_._M_len;
          local_70.piece_._M_len = (size_t)local_140;
          local_140 = (UnknownFieldSet *)0x0;
          if ((UnknownFieldSet *)__ptr != (UnknownFieldSet *)0x0) {
            std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                      ((default_delete<google::protobuf::UnknownFieldSet> *)&local_70,
                       (UnknownFieldSet *)__ptr);
          }
          if (local_140 != (UnknownFieldSet *)0x0) {
            std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                      ((default_delete<google::protobuf::UnknownFieldSet> *)&local_140,local_140);
          }
          iVar22._M_current = ppFVar1;
        } while (ppFVar1 != local_f8._M_current);
      }
      MVar23 = Message::GetMetadata(local_100);
      pUVar15 = Reflection::MutableUnknownFields(MVar23.reflection,local_100);
      UnknownFieldSet::MergeFrom(pUVar15,(UnknownFieldSet *)local_70.piece_._M_len);
      pFVar7 = local_138;
      bVar17 = local_138->field_0x1;
      bVar9 = (bool)((bVar17 & 0x20) >> 5);
      if (0xbf < bVar17 == bVar9) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar9,0xbf < bVar17,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar16);
        goto LAB_00f2b739;
      }
      if ((pFVar7->field_0x1 & 0x20) != 0) {
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
        ::try_emplace_impl<std::vector<int,std::allocator<int>>const&>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>::iterator,_bool>
                    *)&local_130,&this->repeated_option_counts_,&local_e0);
        iVar10 = *(int *)((long)MStack_128.p + 0x18);
        *(int *)((long)MStack_128.p + 0x18) = iVar10 + 1;
        local_140 = (UnknownFieldSet *)CONCAT44(local_140._4_4_,iVar10);
        if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_e0,
                     (iterator)
                     local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_140);
        }
        else {
          *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar10;
          local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,absl::lts_20250127::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>>>>
      ::try_emplace_impl<std::vector<int,std::allocator<int>>const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>::iterator,_bool>
                  *)&local_130,&this->interpreted_paths_,local_40);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)((long)MStack_128.p + 0x18),&local_e0);
    }
    if ((UnknownFieldSet *)local_70.piece_._M_len != (UnknownFieldSet *)0x0) {
      std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                ((default_delete<google::protobuf::UnknownFieldSet> *)&local_70,
                 (UnknownFieldSet *)local_70.piece_._M_len);
    }
LAB_00f2b5ba:
    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (local_f8._M_current == (FieldDescriptor **)0x0) {
      return bVar8;
    }
    operator_delete(local_f8._M_current,(long)local_e8 - (long)local_f8._M_current);
    return bVar8;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,pcVar16);
LAB_00f2b739:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_130)
  ;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path, bool skip_extensions) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError(
        []() -> std::string { return "Option must have a name."; });
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    if (skip_extensions) {
      // Come back to it later.
      return true;
    }
    return AddNameError([]() -> std::string {
      return "Option must not use reserved name \"uninterpreted_option\".";
    });
  }

  if (skip_extensions == uninterpreted_option_->name(0).is_extension()) {
    // Allow feature and option interpretation to occur in two phases.  This is
    // necessary because features *are* options and need to be interpreted
    // before resolving them.  However, options can also *have* features
    // attached to them.
    return true;
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  ABSL_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (!debug_msg_name.empty()) {
      absl::StrAppend(&debug_msg_name, ".");
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      absl::StrAppend(&debug_msg_name, "(", name_part, ")");
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      absl::StrAppend(&debug_msg_name, name_part);
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" is resolved to \"(",
              builder_->undefine_resolved_name_,
              ")\", which is not defined. The innermost scope is searched "
              "first "
              "in name resolution. Consider using a leading '.'(i.e., \"(.",
              debug_msg_name.substr(1),
              "\") to start from the outermost scope.");
        });
      } else {
        return AddNameError([&] {
          return absl::StrCat(
              "Option \"", debug_msg_name, "\" unknown. Ensure that your proto",
              " definition file imports the proto which defines the option.");
        });
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError([&] {
          return absl::StrCat("Option field \"", debug_msg_name,
                              "\" is not a field or extension of message \"",
                              descriptor->name(), "\".");
        });
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      // Special handling to prevent feature use in the same file as the
      // definition.
      // TODO Add proper support for cases where this can work.
      if (field->file() == builder_->file_ &&
          uninterpreted_option_->name(0).name_part() == "features" &&
          !uninterpreted_option_->name(0).is_extension()) {
        return AddNameError([&] {
          return absl::StrCat(
              "Feature \"", debug_msg_name,
              "\" can't be used in the same file it's defined in.");
        });
      }

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError([&] {
            return absl::StrCat("Option \"", debug_msg_name,
                                "\" is an atomic type, not a message.");
          });
        } else if (field->is_repeated()) {
          return AddNameError([&] {
            return absl::StrCat("Option field \"", debug_msg_name,
                                "\" is a repeated message. Repeated message "
                                "options must be initialized using an "
                                "aggregate value.");
          });
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        std::string outstr;
        ABSL_CHECK(unknown_fields->SerializeToString(&outstr))
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        parent_unknown_fields->AddLengthDelimited((*iter)->number(),
                                                  std::move(outstr));
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                        << (*iter)->type();
        return false;
    }
    unknown_fields = std::move(parent_unknown_fields);
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}